

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::FString(FString *this,char *copyStr)

{
  size_t len_00;
  size_t len;
  char *copyStr_local;
  FString *this_local;
  
  if ((copyStr == (char *)0x0) || (*copyStr == '\0')) {
    NullString.RefCount = NullString.RefCount + 1;
    this->Chars = (char *)0xa28dbc;
  }
  else {
    len_00 = strlen(copyStr);
    AllocBuffer(this,len_00);
    StrCopy(this->Chars,copyStr,len_00);
  }
  return;
}

Assistant:

FString::FString (const char *copyStr)
{
	if (copyStr == NULL || *copyStr == '\0')
	{
		NullString.RefCount++;
		Chars = &NullString.Nothing[0];
	}
	else
	{
		size_t len = strlen (copyStr);
		AllocBuffer (len);
		StrCopy (Chars, copyStr, len);
	}
}